

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O2

void exponentialTest(void)

{
  uint __line;
  Model *this;
  System *s;
  System *t;
  long *plVar1;
  char *__assertion;
  double dVar2;
  allocator local_59;
  string local_58 [32];
  string local_38;
  
  this = (Model *)Model::createModel();
  std::__cxx11::string::string(local_58,"sys1",&local_59);
  s = (System *)(**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string(local_58,"sys2",&local_59);
  t = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string((string *)&local_38,"exp",(allocator *)local_58);
  Model::createFlow<FlowExp>(this,&local_38,s,t);
  std::__cxx11::string::~string((string *)&local_38);
  (*(code *)**(undefined8 **)this)(this,0,100);
  std::__cxx11::string::string(local_58,"sys1",&local_59);
  plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_58);
  dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
  if (0.0001 <= ABS(dVar2 + -36.6032)) {
    __assertion = "fabs(m->findSystem(\"sys1\")->getValue() - 36.6032) < 0.0001";
    __line = 0xd;
  }
  else {
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::string(local_58,"sys2",&local_59);
    plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_58);
    dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
    if (ABS(dVar2 + -63.3968) < 0.0001) {
      std::__cxx11::string::~string(local_58);
      return;
    }
    __assertion = "fabs(m->findSystem(\"sys2\")->getValue() - 63.3968) < 0.0001";
    __line = 0xe;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,__line,"void exponentialTest()");
}

Assistant:

void exponentialTest() {
    auto *m = Model::createModel();
    auto *s1 = m->createSystem("sys1", 100.0);
    auto *s2 = m->createSystem("sys2", 0.0);
    m->createFlow<FlowExp>("exp", s1, s2);
    m->execute(0, 100);
    assert(fabs(m->findSystem("sys1")->getValue() - 36.6032) < 0.0001);
    assert(fabs(m->findSystem("sys2")->getValue() - 63.3968) < 0.0001);
}